

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistrhoUtils.cpp
# Opt level: O1

char * DISTRHO::getResourcePath(char *bundlePath)

{
  char *pcVar1;
  
  if (bundlePath == (char *)0x0) {
    d_stderr2("assertion failure: \"%s\" in file %s, line %i","bundlePath != nullptr",
              "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]fverb/dpf/distrho/src/DistrhoUtils.cpp"
              ,0x5f);
    pcVar1 = (char *)0x0;
  }
  else {
    if (getResourcePath(char_const*)::resourcePath == '\0') {
      getResourcePath();
    }
    pcVar1 = getResourcePath::resourcePath.fBuffer;
    if (getResourcePath::resourcePath.fBufferLen == 0) {
      String::_dup(&getResourcePath::resourcePath,(int)bundlePath);
      String::operator+=(&getResourcePath::resourcePath,"/resources");
      pcVar1 = getResourcePath::resourcePath.fBuffer;
    }
  }
  return pcVar1;
}

Assistant:

const char* getResourcePath(const char* const bundlePath) noexcept
{
    DISTRHO_SAFE_ASSERT_RETURN(bundlePath != nullptr, nullptr);

#if defined(DISTRHO_PLUGIN_TARGET_JACK) || defined(DISTRHO_PLUGIN_TARGET_VST2)
    static String resourcePath;

    if (resourcePath.isEmpty())
    {
        resourcePath = bundlePath;
# ifdef DISTRHO_OS_MAC
        resourcePath += "/Contents/Resources";
# else
        resourcePath += DISTRHO_OS_SEP_STR "resources";
# endif
    }

    return resourcePath.buffer();
#elif defined(DISTRHO_PLUGIN_TARGET_LV2)
    static String resourcePath;

    if (resourcePath.isEmpty())
    {
        resourcePath = bundlePath;
        resourcePath += DISTRHO_OS_SEP_STR "resources";
    }

    return resourcePath.buffer();
#elif defined(DISTRHO_PLUGIN_TARGET_VST3)
    static String resourcePath;

    if (resourcePath.isEmpty())
    {
        resourcePath = bundlePath;
        resourcePath += "/Contents/Resources";
    }

    return resourcePath.buffer();
#endif

    return nullptr;
}